

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DequoteToken(Token *p)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  
  uVar1 = p->n;
  if ((1 < uVar1) && (pbVar2 = (byte *)p->z, (char)""[*pbVar2] < '\0')) {
    if (1 < uVar1 - 1) {
      uVar3 = 1;
      do {
        if ((char)""[pbVar2[uVar3]] < '\0') {
          return;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 - 1 != uVar3);
    }
    p->n = uVar1 - 2;
    p->z = (char *)(pbVar2 + 1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteToken(Token *p){
  unsigned int i;
  if( p->n<2 ) return;
  if( !sqlite3Isquote(p->z[0]) ) return;
  for(i=1; i<p->n-1; i++){
    if( sqlite3Isquote(p->z[i]) ) return;
  }
  p->n -= 2;
  p->z++;
}